

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

int UTF8ToHtml(uchar *out,int *outlen,uchar *in,int *inlen)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  htmlEntityDesc *phVar5;
  size_t sVar6;
  long lVar7;
  uchar *outstart;
  byte *pbVar8;
  uint uVar9;
  char *__s;
  byte *pbVar10;
  int local_70;
  int local_50;
  char nbuf [16];
  
  if (inlen == (int *)0x0 || (outlen == (int *)0x0 || out == (uchar *)0x0)) {
    return -1;
  }
  if (in == (uchar *)0x0) {
    *outlen = 0;
    local_50 = 0;
    iVar3 = 0;
  }
  else {
    iVar3 = *inlen;
    iVar2 = *outlen;
    pbVar8 = out;
    for (pbVar10 = in; lVar4 = 1, local_70 = (int)out, pbVar10 < in + iVar3;
        pbVar10 = pbVar10 + lVar7) {
      bVar1 = *pbVar10;
      if ((char)bVar1 < '\0') {
        lVar7 = 4 - (ulong)(bVar1 < 0xf0);
        if (bVar1 < 0xe0) {
          lVar7 = 2;
        }
        if ((long)(in + iVar3) - (long)pbVar10 < lVar7) break;
        uVar9 = (uint)(bVar1 < 0xf0) * 8 + 7;
        if (bVar1 < 0xe0) {
          uVar9 = 0x1f;
        }
        uVar9 = uVar9 & bVar1;
        for (; lVar7 != lVar4; lVar4 = lVar4 + 1) {
          uVar9 = uVar9 << 6 | pbVar10[lVar4] & 0x3f;
        }
        phVar5 = htmlEntityValueLookup(uVar9);
        if (phVar5 == (htmlEntityDesc *)0x0) {
          __s = nbuf;
          snprintf(__s,0x10,"#%u",(ulong)uVar9);
        }
        else {
          __s = phVar5->name;
        }
        sVar6 = strlen(__s);
        if ((long)(out + iVar2) - (long)pbVar8 < (long)((sVar6 << 0x20) + 0x200000000) >> 0x20)
        goto LAB_001639a6;
        *pbVar8 = 0x26;
        sVar6 = (long)(sVar6 << 0x20) >> 0x20;
        memcpy(pbVar8 + 1,__s,sVar6);
        pbVar8 = pbVar8 + sVar6 + 1;
        *pbVar8 = 0x3b;
      }
      else {
        if (out + iVar2 <= pbVar8) {
LAB_001639a6:
          local_70 = (int)pbVar8 - local_70;
          iVar3 = -3;
          goto LAB_001639ae;
        }
        *pbVar8 = bVar1;
        lVar7 = lVar4;
      }
      pbVar8 = pbVar8 + 1;
    }
    local_70 = (int)pbVar8 - local_70;
    iVar3 = local_70;
LAB_001639ae:
    *outlen = local_70;
    local_50 = (int)in;
    local_50 = (int)pbVar10 - local_50;
  }
  *inlen = local_50;
  return iVar3;
}

Assistant:

int
UTF8ToHtml(unsigned char* out, int *outlen,
           const unsigned char* in, int *inlen) {
    const unsigned char* instart = in;
    const unsigned char* inend;
    unsigned char* outstart = out;
    unsigned char* outend;
    int ret = XML_ENC_ERR_SPACE;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL))
        return(XML_ENC_ERR_INTERNAL);

    if (in == NULL) {
        /*
	 * initialization nothing to do
	 */
	*outlen = 0;
	*inlen = 0;
	return(XML_ENC_ERR_SUCCESS);
    }

    inend = in + *inlen;
    outend = out + *outlen;
    while (in < inend) {
        const htmlEntityDesc *ent;
        const char *cp;
        char nbuf[16];
        unsigned c, d;
        int seqlen, len, i;

	d = *in;

	if (d < 0x80) {
            if (out >= outend)
                goto done;
            *out++ = d;
            in += 1;
            continue;
        }

        if (d < 0xE0)      { c = d & 0x1F; seqlen = 2; }
        else if (d < 0xF0) { c = d & 0x0F; seqlen = 3; }
        else               { c = d & 0x07; seqlen = 4; }

	if (inend - in < seqlen)
	    break;

	for (i = 1; i < seqlen; i++) {
	    d = in[i];
	    c <<= 6;
	    c |= d & 0x3F;
	}

        /*
         * Try to lookup a predefined HTML entity for it
         */
        ent = htmlEntityValueLookup(c);

        if (ent == NULL) {
          snprintf(nbuf, sizeof(nbuf), "#%u", c);
          cp = nbuf;
        } else {
          cp = ent->name;
        }

        len = strlen(cp);
        if (outend - out < len + 2)
            goto done;

        *out++ = '&';
        memcpy(out, cp, len);
        out += len;
        *out++ = ';';

        in += seqlen;
    }

    ret = out - outstart;

done:
    *outlen = out - outstart;
    *inlen = in - instart;
    return(ret);
}